

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O2

bool __thiscall
SVGChart::PlotDataContainer::CalculateYRangePlot
          (PlotDataContainer *this,float inXMin,float inXMax,PlotDataBase *inXData,
          PlotDataBase *inYData,float *outYMin,float *outYMax)

{
  long lVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  long theI;
  long inIndex;
  float fVar5;
  float fVar6;
  
  *outYMin = 0.0;
  *outYMax = 0.0;
  lVar1 = PlotDataBase::GetSize(inXData);
  lVar2 = PlotDataBase::GetSize(inYData);
  if (lVar1 == lVar2) {
    bVar4 = false;
    for (inIndex = 0; lVar3 = PlotDataBase::GetSize(inXData), inIndex < lVar3; inIndex = inIndex + 1
        ) {
      fVar5 = PlotDataBase::GetValue(inXData,inIndex);
      fVar6 = PlotDataBase::GetValue(inYData,inIndex);
      if ((inXMin <= fVar5) && (fVar5 <= inXMax)) {
        if (bVar4) {
          if (fVar6 < *outYMin) {
            *outYMin = fVar6;
          }
          bVar4 = true;
          if (fVar6 < *outYMax || fVar6 == *outYMax) goto LAB_00104606;
        }
        else {
          *outYMin = fVar6;
        }
        *outYMax = fVar6;
        bVar4 = true;
      }
LAB_00104606:
    }
  }
  return lVar1 == lVar2;
}

Assistant:

bool PlotDataContainer::CalculateYRangePlot (float inXMin, float inXMax, const PlotDataBase &inXData, const PlotDataBase &inYData, float &outYMin, float &outYMax) const {
        outYMin = 0;
        outYMax = 0;
        // bool theEnteredXRange = false;
        bool initialized = false;
        
        if (inXData.GetSize () != inYData.GetSize ()) {
            return false;
        }

        for (long theI = 0; theI < inXData.GetSize (); theI++) {
            float theX = inXData.GetValue (theI);
            float theY = inYData.GetValue (theI);
            
            if (theX>=inXMin && theX <= inXMax) {
                if (!initialized) {
                    initialized = true;
                    outYMin = theY;
                    outYMax = theY;
                } else {
                    if (theY<outYMin) {
                        outYMin = theY;
                    }
                    if (theY>outYMax) {
                        outYMax = theY;
                    }
                }
            }
        }
        return true;
    }